

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::E_formatter<spdlog::details::scoped_padder>::format
          (E_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  duration dest_00;
  __enable_if_is_duration<std::chrono::duration<long>_> this_00;
  long in_RSI;
  rep seconds;
  duration duration;
  scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff78;
  memory_buf_t *in_stack_ffffffffffffff88;
  padding_info *in_stack_ffffffffffffff90;
  duration<long,_std::ratio<1L,_1L>_> in_stack_ffffffffffffff98;
  scoped_padder *in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffb0;
  
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98.__r,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  dest_00 = std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)(in_RSI + 0x18));
  this_00 = std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      (in_stack_ffffffffffffff78);
  std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
            ((duration<long,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffff98);
  fmt_helper::append_int<long>(in_stack_ffffffffffffffb0,(memory_buf_t *)dest_00.__r);
  scoped_padder::~scoped_padder((scoped_padder *)this_00.__r);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }